

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moving_sphere.h
# Opt level: O1

bool __thiscall
moving_sphere::hit(moving_sphere *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar3 = (r->tm - this->time0) / (this->time1 - this->time0);
  dVar4 = (this->center0).e[0];
  dVar6 = (this->center0).e[1];
  dVar1 = (this->center0).e[2];
  dVar8 = (r->orig).e[0] - (((this->center1).e[0] - dVar4) * dVar3 + dVar4);
  dVar2 = (r->orig).e[1] - (((this->center1).e[1] - dVar6) * dVar3 + dVar6);
  dVar3 = (r->orig).e[2] - (((this->center1).e[2] - dVar1) * dVar3 + dVar1);
  dVar4 = (r->dir).e[0];
  dVar6 = (r->dir).e[1];
  dVar1 = (r->dir).e[2];
  dVar5 = dVar1 * dVar1 + dVar4 * dVar4 + dVar6 * dVar6;
  dVar6 = dVar8 * dVar4 + dVar2 * dVar6 + dVar3 * dVar1;
  dVar4 = dVar6 * dVar6 -
          ((dVar3 * dVar3 + dVar8 * dVar8 + dVar2 * dVar2) - this->radius * this->radius) * dVar5;
  if (dVar4 <= 0.0) {
    return false;
  }
  dVar3 = SQRT(dVar4);
  dVar1 = dVar3;
  if (dVar4 < 0.0) {
    dVar1 = sqrt(dVar4);
  }
  if (dVar4 < 0.0) {
    dVar3 = sqrt(dVar4);
  }
  dVar4 = (-dVar6 - dVar3) / dVar5;
  if ((t_max <= dVar4) || (dVar4 <= t_min)) {
    dVar4 = (dVar1 - dVar6) / dVar5;
    if (t_max <= dVar4) {
      return false;
    }
    if (dVar4 <= t_min) {
      return false;
    }
  }
  rec->t = dVar4;
  dVar3 = (r->dir).e[0] * dVar4 + (r->orig).e[0];
  dVar2 = (r->dir).e[1] * dVar4 + (r->orig).e[1];
  dVar7 = dVar4 * (r->dir).e[2] + (r->orig).e[2];
  (rec->p).e[0] = dVar3;
  (rec->p).e[1] = dVar2;
  (rec->p).e[2] = dVar7;
  dVar5 = (r->tm - this->time0) / (this->time1 - this->time0);
  dVar4 = (this->center0).e[0];
  dVar6 = (this->center0).e[1];
  dVar1 = (this->center0).e[2];
  dVar8 = 1.0 / this->radius;
  dVar4 = (dVar3 - (((this->center1).e[0] - dVar4) * dVar5 + dVar4)) * dVar8;
  dVar6 = (dVar2 - (((this->center1).e[1] - dVar6) * dVar5 + dVar6)) * dVar8;
  dVar8 = dVar8 * (dVar7 - (((this->center1).e[2] - dVar1) * dVar5 + dVar1));
  dVar1 = (r->dir).e[2] * dVar8 + (r->dir).e[0] * dVar4 + (r->dir).e[1] * dVar6;
  rec->front_face = dVar1 < 0.0;
  if (0.0 <= dVar1) {
    dVar4 = -dVar4;
    dVar6 = -dVar6;
    dVar8 = -dVar8;
  }
  (rec->normal).e[0] = dVar4;
  (rec->normal).e[1] = dVar6;
  (rec->normal).e[2] = dVar8;
  (rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(rec->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(this->mat_ptr).super___shared_ptr<material,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return true;
}

Assistant:

bool moving_sphere::hit(const ray& r, double t_min, double t_max, hit_record& rec) const{
    vec3 oc = r.origin() - center(r.time());
    auto a = r.direction().length_squared();
    auto half_b = dot(oc,r.direction());
    auto c = oc.length_squared() - radius * radius;
    auto discriminant = half_b * half_b - a * c;

    if (discriminant > 0) {
        auto root = sqrt(discriminant);
        auto temp = (-half_b - sqrt(discriminant)) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }

        temp = (-half_b + root) / a;
        if (temp < t_max && temp > t_min){
            rec.t = temp;
            rec.p = r.at(rec.t);
            vec3 outward_normal = (rec.p - center(r.time())) / radius;
            rec.set_face_normal(r,outward_normal);
            rec.mat_ptr = mat_ptr;
            return true;
        }
    }

    return false;
}